

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O1

char * Extra_MmStepEntryFetch(Extra_MmStep_t *p,int nBytes)

{
  int iVar1;
  void **ppvVar2;
  char *pcVar3;
  void *pvVar4;
  size_t __size;
  
  if (nBytes == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    if (nBytes <= p->nMapSize) {
      pcVar3 = Extra_MmFixedEntryFetch(p->pMap[nBytes]);
      return pcVar3;
    }
    if (p->nLargeChunks == p->nLargeChunksAlloc) {
      if (p->nLargeChunksAlloc == 0) {
        p->nLargeChunksAlloc = 0x20;
      }
      iVar1 = p->nLargeChunksAlloc;
      p->nLargeChunksAlloc = iVar1 * 2;
      __size = (long)iVar1 << 4;
      if (p->pLargeChunks == (void **)0x0) {
        ppvVar2 = (void **)malloc(__size);
      }
      else {
        ppvVar2 = (void **)realloc(p->pLargeChunks,__size);
      }
      p->pLargeChunks = ppvVar2;
    }
    pvVar4 = malloc((long)nBytes);
    iVar1 = p->nLargeChunks;
    p->nLargeChunks = iVar1 + 1;
    p->pLargeChunks[iVar1] = pvVar4;
    pcVar3 = (char *)p->pLargeChunks[iVar1];
  }
  return pcVar3;
}

Assistant:

char * Extra_MmStepEntryFetch( Extra_MmStep_t * p, int nBytes )
{
    if ( nBytes == 0 )
        return NULL;
    if ( nBytes > p->nMapSize )
    {
//        printf( "Allocating %d bytes.\n", nBytes );
//        return ABC_ALLOC( char, nBytes );
        if ( p->nLargeChunks == p->nLargeChunksAlloc )
        {
            if ( p->nLargeChunksAlloc == 0 )
                p->nLargeChunksAlloc = 32;
            p->nLargeChunksAlloc *= 2;
            p->pLargeChunks = ABC_REALLOC( void *, p->pLargeChunks, p->nLargeChunksAlloc );
        }
        p->pLargeChunks[ p->nLargeChunks++ ] = ABC_ALLOC( char, nBytes );
        return (char *)p->pLargeChunks[ p->nLargeChunks - 1 ];
    }
    return Extra_MmFixedEntryFetch( p->pMap[nBytes] );
}